

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

PointerType __thiscall capnp::_::PointerReader::getPointerType(PointerReader *this)

{
  word *pwVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar5;
  ulong uVar6;
  PointerType PVar7;
  long lVar8;
  ulong uVar9;
  WirePointer *pWVar10;
  WirePointer *pWVar11;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *this_00;
  WirePointer *pWVar12;
  SegmentReader *sgmt;
  SegmentReader *newSegment;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition;
  Fault f_2;
  
  pWVar10 = this->pointer;
  if (pWVar10 == (WirePointer *)0x0) {
    return NULL_;
  }
  uVar4 = (pWVar10->offsetAndKind).value;
  if ((pWVar10->field_1).upper32Bits == 0 && uVar4 == 0) {
    return NULL_;
  }
  sgmt = this->segment;
  if (sgmt == (SegmentReader *)0x0) {
    sgmt = (SegmentReader *)0x0;
    uVar4 = (pWVar10->offsetAndKind).value;
    PVar7 = STRUCT;
    switch(uVar4 & 3) {
    case 0:
      goto switchD_0017f0b3_caseD_0;
    case 1:
      goto switchD_0017f0b3_caseD_0;
    case 2:
      goto switchD_0017f0b3_caseD_2;
    case 3:
switchD_0017f0b3_caseD_3:
      newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,uVar4 == 3);
      if (uVar4 == 3) {
        return CAPABILITY;
      }
      this_00 = &_kjCondition;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[21]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0xadb,FAILED,"ptr->isCapability()","_kjCondition,\"unknown pointer type\"",
                 (DebugExpression<bool> *)&newSegment,(char (*) [21])"unknown pointer type");
    }
  }
  else {
    lVar8 = (long)((int)uVar4 >> 2);
    pwVar1 = (sgmt->ptr).ptr;
    pWVar11 = (WirePointer *)(pwVar1 + (sgmt->ptr).size_);
    pWVar12 = pWVar10 + lVar8 + 1;
    if ((long)pWVar11 - (long)(pWVar10 + 1) >> 3 < lVar8) {
      pWVar12 = pWVar11;
    }
    if (lVar8 < (long)pwVar1 - (long)(pWVar10 + 1) >> 3) {
      pWVar12 = pWVar11;
    }
    if ((uVar4 & 3) == 2) {
      iVar3 = (*sgmt->arena->_vptr_Arena[2])();
      sgmt = (SegmentReader *)CONCAT44(extraout_var,iVar3);
      _kjCondition.left = &sgmt;
      _kjCondition.right = (void *)0x0;
      _kjCondition.op.content.ptr = " != ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = sgmt != (SegmentReader *)0x0;
      if (sgmt == (SegmentReader *)0x0) {
        this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                  ((Fault *)this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x244,FAILED,"segment != nullptr",
                   "_kjCondition,\"Message contains far pointer to unknown segment.\"",&_kjCondition
                   ,(char (*) [49])"Message contains far pointer to unknown segment.");
      }
      else {
        uVar4 = (pWVar10->offsetAndKind).value;
        uVar9 = (ulong)(uVar4 >> 3);
        uVar2 = (sgmt->ptr).size_;
        if ((long)uVar2 < (long)uVar9) {
          uVar9 = uVar2;
        }
        uVar6 = 2 - (ulong)((uVar4 & 4) == 0);
        if (uVar9 + uVar6 <= uVar2) {
          pWVar11 = (WirePointer *)((sgmt->ptr).ptr + uVar9);
          uVar2 = sgmt->readLimiter->limit;
          if (uVar6 <= uVar2) {
            sgmt->readLimiter->limit = uVar2 - uVar6;
            if (((pWVar10->offsetAndKind).value & 4) != 0) {
              iVar3 = (*sgmt->arena->_vptr_Arena[2])
                                (sgmt->arena,(ulong)(pWVar11->field_1).upper32Bits);
              newSegment = (SegmentReader *)CONCAT44(extraout_var_00,iVar3);
              _kjCondition.left = &newSegment;
              _kjCondition.right = (void *)0x0;
              _kjCondition.op.content.ptr = " != ";
              _kjCondition.op.content.size_ = 5;
              _kjCondition.result = newSegment != (SegmentReader *)0x0;
              if (newSegment == (SegmentReader *)0x0) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                          (&f_2,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x25f,FAILED,"newSegment != nullptr",
                           "_kjCondition,\"Message contains double-far pointer to unknown segment.\""
                           ,&_kjCondition,
                           (char (*) [56])"Message contains double-far pointer to unknown segment.")
                ;
LAB_0017f31f:
                pWVar12 = (WirePointer *)0x0;
                kj::_::Debug::Fault::~Fault(&f_2);
              }
              else {
                uVar4 = (pWVar11->offsetAndKind).value;
                uVar5 = uVar4 & 3;
                _kjCondition.left = (SegmentReader **)CONCAT44(2,uVar5);
                _kjCondition.right = " == ";
                _kjCondition.op.content.ptr = (char *)0x5;
                _kjCondition.op.content.size_ = (size_t)(uVar5 == 2);
                if (uVar5 != 2) {
                  kj::_::Debug::Fault::
                  Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                            (&f_2,
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                             ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                             "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                             (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                              *)&_kjCondition,
                             (char (*) [51])"Second word of double-far pad must be far pointer.");
                  goto LAB_0017f31f;
                }
                uVar9 = (ulong)(uVar4 >> 3);
                uVar2 = (newSegment->ptr).size_;
                if ((long)uVar2 < (long)uVar9) {
                  uVar9 = uVar2;
                }
                pWVar12 = (WirePointer *)((newSegment->ptr).ptr + uVar9);
                sgmt = newSegment;
              }
              pWVar10 = pWVar11 + 1;
              goto LAB_0017f08f;
            }
            if (sgmt != (SegmentReader *)0x0) {
              lVar8 = (long)((int)(pWVar11->offsetAndKind).value >> 2);
              pwVar1 = (sgmt->ptr).ptr;
              pWVar12 = (WirePointer *)(pwVar1 + (sgmt->ptr).size_);
              pWVar10 = pWVar11;
              if ((lVar8 < (long)pwVar1 - (long)(pWVar11 + 1) >> 3) ||
                 ((long)pWVar12 - (long)(pWVar11 + 1) >> 3 < lVar8)) goto LAB_0017f08f;
            }
            goto LAB_0017f098;
          }
          (*sgmt->arena->_vptr_Arena[3])();
        }
        newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
        this_00 = &_kjCondition;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                  ((Fault *)this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                   "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                   ,(DebugExpression<bool> *)&newSegment,
                   (char (*) [318])
                   "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                  );
      }
    }
    else {
LAB_0017f08f:
      pWVar11 = pWVar10;
      if (pWVar12 == (WirePointer *)0x0) {
        return NULL_;
      }
LAB_0017f098:
      uVar4 = (pWVar11->offsetAndKind).value;
      switch(uVar4 & 3) {
      case 0:
        return STRUCT;
      case 1:
switchD_0017f0b3_caseD_0:
        return LIST;
      case 3:
        goto switchD_0017f0b3_caseD_3;
      }
switchD_0017f0b3_caseD_2:
      this_00 = &_kjCondition;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0xad5,FAILED,(char *)0x0,"\"far pointer not followed?\"",
                 (char (*) [26])"far pointer not followed?");
    }
  }
  PVar7 = NULL_;
  kj::_::Debug::Fault::~Fault((Fault *)this_00);
switchD_0017f0b3_caseD_0:
  return PVar7;
}

Assistant:

PointerType PointerReader::getPointerType() const {
  if(pointer == nullptr || pointer->isNull()) {
    return PointerType::NULL_;
  } else {
    const WirePointer* ptr = pointer;
    const word* refTarget = ptr->target(segment);
    SegmentReader* sgmt = segment;
    if (WireHelpers::followFars(ptr, refTarget, sgmt) == kj::none) return PointerType::NULL_;
    switch(ptr->kind()) {
      case WirePointer::FAR:
        KJ_FAIL_ASSERT("far pointer not followed?") { return PointerType::NULL_; }
      case WirePointer::STRUCT:
        return PointerType::STRUCT;
      case WirePointer::LIST:
        return PointerType::LIST;
      case WirePointer::OTHER:
        KJ_REQUIRE(ptr->isCapability(), "unknown pointer type") { return PointerType::NULL_; }
        return PointerType::CAPABILITY;
    }
    KJ_UNREACHABLE;
  }
}